

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O3

int metadata_filter(archive *a,void *_data,archive_entry *entry)

{
  char cVar1;
  wchar_t wVar2;
  char *pcVar3;
  
  cVar1 = (char)*(uint *)((long)_data + 0x24);
  if ((*(uint *)((long)_data + 0x24) & 0x20) != 0) {
    pcVar3 = archive_entry_pathname(entry);
    wVar2 = yes("add \'%s\'",pcVar3);
    if (wVar2 == L'\0') {
      return 0;
    }
    cVar1 = (char)*(undefined4 *)((long)_data + 0x24);
  }
  if ((-1 < cVar1) && (wVar2 = archive_read_disk_can_descend(a), wVar2 != L'\0')) {
    archive_read_disk_descend(a);
  }
  return 1;
}

Assistant:

static int
metadata_filter(struct archive *a, void *_data, struct archive_entry *entry)
{
	struct bsdtar *bsdtar = (struct bsdtar *)_data;

	/* XXX TODO: check whether this filesystem is
	 * synthetic and/or local.  Add a new
	 * --local-only option to skip non-local
	 * filesystems.  Skip synthetic filesystems
	 * regardless.
	 *
	 * The results should be cached, since
	 * tree.c doesn't usually visit a directory
	 * and the directory contents together.  A simple
	 * move-to-front list should perform quite well.
	 *
	 * Use archive_read_disk_current_filesystem_is_remote().
	 */

	/*
	 * If the user vetoes this file/directory, skip it.
	 * We want this to be fairly late; if some other
	 * check would veto this file, we shouldn't bother
	 * the user with it.
	 */
	if ((bsdtar->flags & OPTFLAG_INTERACTIVE) &&
	    !yes("add '%s'", archive_entry_pathname(entry)))
		return (0);

	/* Note: if user vetoes, we won't descend. */
	if (((bsdtar->flags & OPTFLAG_NO_SUBDIRS) == 0) &&
	    archive_read_disk_can_descend(a))
		archive_read_disk_descend(a);

	return (1);
}